

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_api.c
# Opt level: O0

int amqp_set_handshake_timeout(amqp_connection_state_t state,timeval *timeout)

{
  timeval *timeout_local;
  amqp_connection_state_t state_local;
  
  if (timeout == (timeval *)0x0) {
    state->handshake_timeout = (timeval *)0x0;
  }
  else {
    if ((timeout->tv_sec < 0) || (timeout->tv_usec < 0)) {
      return -10;
    }
    (state->internal_handshake_timeout).tv_sec = timeout->tv_sec;
    (state->internal_handshake_timeout).tv_usec = timeout->tv_usec;
    state->handshake_timeout = &state->internal_handshake_timeout;
  }
  return 0;
}

Assistant:

int amqp_set_handshake_timeout(amqp_connection_state_t state,
                               const struct timeval *timeout) {
  if (timeout) {
    if (timeout->tv_sec < 0 || timeout->tv_usec < 0) {
      return AMQP_STATUS_INVALID_PARAMETER;
    }
    state->internal_handshake_timeout = *timeout;
    state->handshake_timeout = &state->internal_handshake_timeout;
  } else {
    state->handshake_timeout = NULL;
  }

  return AMQP_STATUS_OK;
}